

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Array_encodeBinaryOverlayable(uintptr_t ptr,size_t length,size_t elementMemSize)

{
  UA_StatusCode UVar1;
  ulong uVar2;
  size_t __n;
  UA_StatusCode retval;
  size_t possibleMem;
  size_t possible;
  size_t finished;
  size_t elementMemSize_local;
  size_t length_local;
  uintptr_t ptr_local;
  
  possible = 0;
  length_local = ptr;
  do {
    if (pos + elementMemSize * (length - possible) <= end) {
      memcpy(pos,(void *)length_local,elementMemSize * (length - possible));
      pos = pos + elementMemSize * (length - possible);
      return 0;
    }
    uVar2 = (ulong)((long)end - (long)pos) / elementMemSize;
    __n = uVar2 * elementMemSize;
    memcpy(pos,(void *)length_local,__n);
    pos = pos + __n;
    length_local = __n + length_local;
    possible = uVar2 + possible;
    UVar1 = exchangeBuffer();
  } while (UVar1 == 0);
  return UVar1;
}

Assistant:

static UA_StatusCode
Array_encodeBinaryOverlayable(uintptr_t ptr, size_t length, size_t elementMemSize) {
    /* Store the number of already encoded elements */
    size_t finished = 0;

    /* Loop as long as more elements remain than fit into the chunk */
    while(end < pos + (elementMemSize * (length-finished))) {
        size_t possible = ((uintptr_t)end - (uintptr_t)pos) / (sizeof(UA_Byte) * elementMemSize);
        size_t possibleMem = possible * elementMemSize;
        memcpy(pos, (void*)ptr, possibleMem);
        pos += possibleMem;
        ptr += possibleMem;
        finished += possible;
        UA_StatusCode retval = exchangeBuffer();
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
    }

    /* Encode the remaining elements */
    memcpy(pos, (void*)ptr, elementMemSize * (length-finished));
    pos += elementMemSize * (length-finished);
    return UA_STATUSCODE_GOOD;
}